

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O0

cTValue * lj_tab_getstr(GCtab *t,GCstr *key)

{
  Node *n;
  GCstr *key_local;
  GCtab *t_local;
  Node *n_1;
  
  n = (Node *)((ulong)(t->node).ptr32 + (ulong)(key->hash & t->hmask) * 0x18);
  while (((n->key).field_2.it != 0xfffffffb || ((GCstr *)(ulong)(n->key).u32.lo != key))) {
    n = (Node *)(ulong)(n->next).ptr32;
    if (n == (Node *)0x0) {
      return (cTValue *)0x0;
    }
  }
  return &n->val;
}

Assistant:

cTValue *lj_tab_getstr(GCtab *t, GCstr *key)
{
  Node *n = hashstr(t, key);
  do {
    if (tvisstr(&n->key) && strV(&n->key) == key)
      return &n->val;
  } while ((n = nextnode(n)));
  return NULL;
}